

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O1

bool __thiscall leveldb::anon_unknown_3::DBIter::ParseKey(DBIter *this,ParsedInternalKey *ikey)

{
  ulong uVar1;
  int iVar2;
  undefined4 extraout_var;
  uint uVar4;
  ValueType VVar5;
  ulong uVar6;
  uint uVar7;
  ulong extraout_RDX;
  long extraout_RDX_00;
  bool bVar8;
  Slice key;
  Status local_58;
  Slice local_50;
  Slice local_40;
  char *pcVar3;
  
  iVar2 = (*this->iter_->_vptr_Iterator[8])();
  pcVar3 = (char *)CONCAT44(extraout_var,iVar2);
  (*this->iter_->_vptr_Iterator[9])();
  while (uVar1 = this->bytes_until_read_sampling_, uVar1 < extraout_RDX_00 + extraout_RDX) {
    uVar6 = (ulong)(this->rnd_).seed_ * 0x41a7;
    uVar4 = (uint)uVar6 & 0x7fffffff;
    iVar2 = (int)(uVar6 >> 0x1f);
    uVar7 = iVar2 + uVar4;
    uVar4 = iVar2 + uVar4 + 0x80000001;
    if (-1 < (int)uVar7) {
      uVar4 = uVar7;
    }
    (this->rnd_).seed_ = uVar4;
    this->bytes_until_read_sampling_ = (uVar4 & 0x1fffff) + uVar1;
    key.size_ = extraout_RDX;
    key.data_ = pcVar3;
    DBImpl::RecordReadSample(this->db_,key);
  }
  this->bytes_until_read_sampling_ = uVar1 - (extraout_RDX_00 + extraout_RDX);
  if (extraout_RDX < 8) {
    bVar8 = false;
  }
  else {
    VVar5 = (ValueType)*(ulong *)(pcVar3 + (extraout_RDX - 8)) & 0xff;
    ikey->sequence = *(ulong *)(pcVar3 + (extraout_RDX - 8)) >> 8;
    ikey->type = VVar5;
    (ikey->user_key).data_ = pcVar3;
    (ikey->user_key).size_ = extraout_RDX - 8;
    bVar8 = VVar5 < 2;
  }
  if (bVar8 == false) {
    local_40.data_ = "corrupted internal key in DBIter";
    local_40.size_ = 0x20;
    local_50.data_ = "";
    local_50.size_ = 0;
    Status::Status(&local_58,kCorruption,&local_40,&local_50);
    pcVar3 = (this->status_).state_;
    (this->status_).state_ = local_58.state_;
    if (pcVar3 != (char *)0x0) {
      local_58.state_ = pcVar3;
      operator_delete__(pcVar3);
    }
  }
  return bVar8;
}

Assistant:

inline bool DBIter::ParseKey(ParsedInternalKey* ikey) {
  Slice k = iter_->key();

  size_t bytes_read = k.size() + iter_->value().size();
  while (bytes_until_read_sampling_ < bytes_read) {
    bytes_until_read_sampling_ += RandomCompactionPeriod();
    db_->RecordReadSample(k);
  }
  assert(bytes_until_read_sampling_ >= bytes_read);
  bytes_until_read_sampling_ -= bytes_read;

  if (!ParseInternalKey(k, ikey)) {
    status_ = Status::Corruption("corrupted internal key in DBIter");
    return false;
  } else {
    return true;
  }
}